

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPreviewSurface>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPreviewSurface *surface,string *warn,string *err,PrimReconstructOptions *options)

{
  Property *prop;
  long *plVar1;
  pointer pcVar2;
  long lVar3;
  _Base_ptr p_Var4;
  uint uVar5;
  char *pcVar6;
  undefined1 *puVar7;
  undefined7 uVar8;
  void *pvVar9;
  size_type sVar10;
  size_type sVar11;
  int iVar12;
  ostream *poVar13;
  long *plVar14;
  ulong uVar15;
  type poVar16;
  const_iterator cVar17;
  mapped_type *this;
  _Base_ptr p_Var18;
  char cVar19;
  undefined4 uVar20;
  Property *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  size_type __n;
  char cVar21;
  char cVar22;
  string *__return_storage_ptr__;
  undefined8 uVar23;
  _Alloc_hider _Var24;
  Animatable<tinyusdz::value::normal3f> *pAVar25;
  bool bVar26;
  Animatable<tinyusdz::value::normal3f> animatable_value;
  ParseResult ret_10;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string attr_type_name;
  ostringstream ss_e;
  undefined1 local_5d8 [16];
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  local_5c8;
  bool bStack_5b0;
  undefined1 local_5a8 [8];
  uint *local_5a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_598;
  undefined1 local_580 [16];
  undefined1 local_570 [40];
  PrimVar *local_548;
  string *local_540;
  UsdPreviewSurface *local_538;
  storage_union local_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_510;
  string local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  _Base_ptr local_4a0;
  optional<tinyusdz::Animatable<tinyusdz::value::normal3f>> *local_498;
  string *local_490;
  AttrMetas *local_488;
  string local_480;
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 uStack_440;
  undefined7 uStack_43f;
  bool bStack_438;
  undefined7 uStack_437;
  undefined1 local_430;
  ios_base local_3f0 [16];
  ios_base local_3e0 [264];
  string local_2d8;
  _Base_ptr local_2b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_2b0;
  TypedTerminalAttribute<tinyusdz::Token> *local_2a8;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_2a0;
  TypedTerminalAttribute<tinyusdz::Token> *local_298;
  TypedAttributeWithFallback<tinyusdz::Animatable<int>_> *local_290;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_288;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_280;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_278;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_270;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_268;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_260;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_258;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_250;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *local_248;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_240;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *local_238;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *local_230;
  _Base_ptr local_228;
  string local_220;
  string local_200;
  string local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  long local_1b0 [2];
  string local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  long local_130 [2];
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  undefined8 local_3d;
  float local_35;
  
  local_510._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_510._M_impl.super__Rb_tree_header._M_header;
  local_510._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_510._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_510._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_510._M_impl.super__Rb_tree_header._M_header._M_right =
       local_510._M_impl.super__Rb_tree_header._M_header._M_left;
  local_460._0_8_ = local_450;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_510,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460);
  if ((undefined1 *)local_460._0_8_ != local_450) {
    operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
  }
  p_Var18 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_228 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  bVar26 = true;
  if (p_Var18 != local_228) {
    local_230 = &surface->diffuseColor;
    local_238 = &surface->emissiveColor;
    local_240 = &surface->roughness;
    local_248 = &surface->specularColor;
    local_250 = &surface->metallic;
    local_258 = &surface->clearcoat;
    local_260 = &surface->clearcoatRoughness;
    local_268 = &surface->opacity;
    local_270 = &surface->opacityThreshold;
    local_278 = &surface->ior;
    local_488 = &(surface->normal)._metas;
    local_2a0 = &(surface->normal)._paths;
    local_498 = (optional<tinyusdz::Animatable<tinyusdz::value::normal3f>> *)
                &(surface->normal)._attrib;
    local_280 = &surface->displacement;
    local_288 = &surface->occlusion;
    local_290 = &surface->useSpecularWorkflow;
    local_298 = &surface->outputsSurface;
    local_2a8 = &surface->outputsDisplacement;
    local_2b0 = &(surface->super_ShaderNode).super_UsdShadePrim.props;
    local_538 = surface;
    local_490 = warn;
    do {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,*(long *)(p_Var18 + 1),
                 (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
      prop = (Property *)(p_Var18 + 2);
      local_460._0_8_ = local_450;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_460,"inputs:diffuseColor","");
      pAVar25 = (Animatable<tinyusdz::value::normal3f> *)local_460;
      anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                ((ParseResult *)local_580,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_510,&local_60,prop,(string *)local_460,local_230);
      if ((undefined1 *)local_460._0_8_ != local_450) {
        operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      uVar5 = CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0]));
      iVar12 = 0;
      if ((uVar5 & 0xfffffffd) == 0) {
        iVar12 = 3;
LAB_002348ea:
        bVar26 = false;
      }
      else {
        bVar26 = true;
        if (uVar5 != 1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_460,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_460,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
          poVar13 = (ostream *)
                    ::std::ostream::operator<<
                              ((Animatable<tinyusdz::value::normal3f> *)local_460,0xf98);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          pcVar2 = local_5a8 + 0x10;
          local_5a8 = (undefined1  [8])pcVar2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5a8,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[20],std::__cxx11::string>
                    ((string *)local_5d8,(fmt *)local_5a8,(string *)"inputs:diffuseColor",
                     (char (*) [20])(local_580 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar25);
          poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_460,
                               (char *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                               CONCAT26(local_5d8._14_2_,CONCAT24(local_5d8._12_2_,local_5d8._8_4_))
                              );
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
          if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
            operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                             *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                            (long)local_5c8.
                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1);
          }
          if (local_5a8 != (undefined1  [8])pcVar2) {
            operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar14 = (long *)::std::__cxx11::string::_M_append
                                        (local_5a8,(ulong)(err->_M_dataplus)._M_p);
            local_5d8._0_6_ = SUB86(&local_5c8,0);
            local_5d8._6_2_ = (undefined2)((ulong)&local_5c8 >> 0x30);
            lVar3 = *plVar14;
            plVar1 = plVar14 + 2;
            if ((long *)lVar3 == plVar1) {
              local_5c8.
              super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
              local_5c8.
              super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)plVar14[3];
              local_5c8.
              super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                   (undefined7)((ulong)plVar14[3] >> 8);
            }
            else {
              local_5d8._0_6_ = (undefined6)lVar3;
              local_5d8._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
              local_5c8.
              super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
            }
            lVar3 = plVar14[1];
            local_5d8._8_4_ = (undefined4)lVar3;
            local_5d8._12_2_ = (undefined2)((ulong)lVar3 >> 0x20);
            local_5d8._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
            *plVar14 = (long)plVar1;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (local_5a8 != (undefined1  [8])pcVar2) {
              operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
          ::std::ios_base::~ios_base(local_3f0);
          iVar12 = 1;
          goto LAB_002348ea;
        }
      }
      puVar7 = (undefined1 *)CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_));
      if (puVar7 != local_570 + 8) {
        operator_delete(puVar7,CONCAT71(local_570._9_7_,local_570[8]) + 1);
      }
      if (bVar26) {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_460._0_8_ = local_450;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_460,"inputs:emissiveColor","");
        pAVar25 = (Animatable<tinyusdz::value::normal3f> *)local_460;
        anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                  ((ParseResult *)local_580,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_510,&local_80,prop,(string *)local_460,local_238);
        if ((undefined1 *)local_460._0_8_ != local_450) {
          operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        uVar5 = CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0]));
        iVar12 = 0;
        if ((uVar5 & 0xfffffffd) == 0) {
          iVar12 = 3;
LAB_00234bee:
          bVar26 = false;
        }
        else {
          bVar26 = true;
          if (uVar5 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
            poVar13 = (ostream *)
                      ::std::ostream::operator<<
                                ((Animatable<tinyusdz::value::normal3f> *)local_460,0xf9a);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar2 = local_5a8 + 0x10;
            local_5a8 = (undefined1  [8])pcVar2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[21],std::__cxx11::string>
                      ((string *)local_5d8,(fmt *)local_5a8,(string *)"inputs:emissiveColor",
                       (char (*) [21])(local_580 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar25)
            ;
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_460,
                                 (char *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                 CONCAT26(local_5d8._14_2_,
                                          CONCAT24(local_5d8._12_2_,local_5d8._8_4_)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (local_5a8 != (undefined1  [8])pcVar2) {
              operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar14 = (long *)::std::__cxx11::string::_M_append
                                          (local_5a8,(ulong)(err->_M_dataplus)._M_p);
              local_5d8._0_6_ = SUB86(&local_5c8,0);
              local_5d8._6_2_ = (undefined2)((ulong)&local_5c8 >> 0x30);
              lVar3 = *plVar14;
              plVar1 = plVar14 + 2;
              if ((long *)lVar3 == plVar1) {
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)plVar14[3];
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                     (undefined7)((ulong)plVar14[3] >> 8);
              }
              else {
                local_5d8._0_6_ = (undefined6)lVar3;
                local_5d8._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
              }
              lVar3 = plVar14[1];
              local_5d8._8_4_ = (undefined4)lVar3;
              local_5d8._12_2_ = (undefined2)((ulong)lVar3 >> 0x20);
              local_5d8._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
              *plVar14 = (long)plVar1;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                (long)local_5c8.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              if (local_5a8 != (undefined1  [8])pcVar2) {
                operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
            ::std::ios_base::~ios_base(local_3f0);
            iVar12 = 1;
            goto LAB_00234bee;
          }
        }
        puVar7 = (undefined1 *)CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_));
        if (puVar7 != local_570 + 8) {
          operator_delete(puVar7,CONCAT71(local_570._9_7_,local_570[8]) + 1);
        }
        if (!bVar26) goto LAB_0023808a;
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_460._0_8_ = local_450;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"inputs:roughness","")
        ;
        pAVar25 = (Animatable<tinyusdz::value::normal3f> *)local_460;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_580,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_510,&local_a0,prop,(string *)local_460,local_240);
        if ((undefined1 *)local_460._0_8_ != local_450) {
          operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        uVar5 = CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0]));
        iVar12 = 0;
        if ((uVar5 & 0xfffffffd) == 0) {
          iVar12 = 3;
LAB_00234ef2:
          bVar26 = false;
        }
        else {
          bVar26 = true;
          if (uVar5 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
            poVar13 = (ostream *)
                      ::std::ostream::operator<<
                                ((Animatable<tinyusdz::value::normal3f> *)local_460,0xf9c);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar2 = local_5a8 + 0x10;
            local_5a8 = (undefined1  [8])pcVar2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[17],std::__cxx11::string>
                      ((string *)local_5d8,(fmt *)local_5a8,(string *)"inputs:roughness",
                       (char (*) [17])(local_580 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar25)
            ;
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_460,
                                 (char *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                 CONCAT26(local_5d8._14_2_,
                                          CONCAT24(local_5d8._12_2_,local_5d8._8_4_)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (local_5a8 != (undefined1  [8])pcVar2) {
              operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar14 = (long *)::std::__cxx11::string::_M_append
                                          (local_5a8,(ulong)(err->_M_dataplus)._M_p);
              local_5d8._0_6_ = SUB86(&local_5c8,0);
              local_5d8._6_2_ = (undefined2)((ulong)&local_5c8 >> 0x30);
              lVar3 = *plVar14;
              plVar1 = plVar14 + 2;
              if ((long *)lVar3 == plVar1) {
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)plVar14[3];
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                     (undefined7)((ulong)plVar14[3] >> 8);
              }
              else {
                local_5d8._0_6_ = (undefined6)lVar3;
                local_5d8._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
              }
              lVar3 = plVar14[1];
              local_5d8._8_4_ = (undefined4)lVar3;
              local_5d8._12_2_ = (undefined2)((ulong)lVar3 >> 0x20);
              local_5d8._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
              *plVar14 = (long)plVar1;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                (long)local_5c8.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              if (local_5a8 != (undefined1  [8])pcVar2) {
                operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
            ::std::ios_base::~ios_base(local_3f0);
            iVar12 = 1;
            goto LAB_00234ef2;
          }
        }
        puVar7 = (undefined1 *)CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_));
        if (puVar7 != local_570 + 8) {
          operator_delete(puVar7,CONCAT71(local_570._9_7_,local_570[8]) + 1);
        }
        if (!bVar26) goto LAB_0023808a;
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_460._0_8_ = local_450;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_460,"inputs:specularColor","");
        pAVar25 = (Animatable<tinyusdz::value::normal3f> *)local_460;
        anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                  ((ParseResult *)local_580,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_510,&local_c0,prop,(string *)local_460,local_248);
        if ((undefined1 *)local_460._0_8_ != local_450) {
          operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        uVar5 = CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0]));
        iVar12 = 0;
        if ((uVar5 & 0xfffffffd) == 0) {
          iVar12 = 3;
LAB_002351f6:
          bVar26 = false;
        }
        else {
          bVar26 = true;
          if (uVar5 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
            poVar13 = (ostream *)
                      ::std::ostream::operator<<
                                ((Animatable<tinyusdz::value::normal3f> *)local_460,0xf9e);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar2 = local_5a8 + 0x10;
            local_5a8 = (undefined1  [8])pcVar2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[21],std::__cxx11::string>
                      ((string *)local_5d8,(fmt *)local_5a8,(string *)"inputs:specularColor",
                       (char (*) [21])(local_580 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar25)
            ;
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_460,
                                 (char *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                 CONCAT26(local_5d8._14_2_,
                                          CONCAT24(local_5d8._12_2_,local_5d8._8_4_)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (local_5a8 != (undefined1  [8])pcVar2) {
              operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar14 = (long *)::std::__cxx11::string::_M_append
                                          (local_5a8,(ulong)(err->_M_dataplus)._M_p);
              local_5d8._0_6_ = SUB86(&local_5c8,0);
              local_5d8._6_2_ = (undefined2)((ulong)&local_5c8 >> 0x30);
              lVar3 = *plVar14;
              plVar1 = plVar14 + 2;
              if ((long *)lVar3 == plVar1) {
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)plVar14[3];
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                     (undefined7)((ulong)plVar14[3] >> 8);
              }
              else {
                local_5d8._0_6_ = (undefined6)lVar3;
                local_5d8._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
              }
              lVar3 = plVar14[1];
              local_5d8._8_4_ = (undefined4)lVar3;
              local_5d8._12_2_ = (undefined2)((ulong)lVar3 >> 0x20);
              local_5d8._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
              *plVar14 = (long)plVar1;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                (long)local_5c8.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              if (local_5a8 != (undefined1  [8])pcVar2) {
                operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
            ::std::ios_base::~ios_base(local_3f0);
            iVar12 = 1;
            goto LAB_002351f6;
          }
        }
        puVar7 = (undefined1 *)CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_));
        if (puVar7 != local_570 + 8) {
          operator_delete(puVar7,CONCAT71(local_570._9_7_,local_570[8]) + 1);
        }
        if (!bVar26) goto LAB_0023808a;
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_460._0_8_ = local_450;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"inputs:metallic","");
        pAVar25 = (Animatable<tinyusdz::value::normal3f> *)local_460;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_580,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_510,&local_e0,prop,(string *)local_460,local_250);
        if ((undefined1 *)local_460._0_8_ != local_450) {
          operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        uVar5 = CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0]));
        iVar12 = 0;
        if ((uVar5 & 0xfffffffd) == 0) {
          iVar12 = 3;
LAB_002354fa:
          bVar26 = false;
        }
        else {
          bVar26 = true;
          if (uVar5 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
            poVar13 = (ostream *)
                      ::std::ostream::operator<<
                                ((Animatable<tinyusdz::value::normal3f> *)local_460,4000);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar2 = local_5a8 + 0x10;
            local_5a8 = (undefined1  [8])pcVar2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[16],std::__cxx11::string>
                      ((string *)local_5d8,(fmt *)local_5a8,(string *)"inputs:metallic",
                       (char (*) [16])(local_580 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar25)
            ;
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_460,
                                 (char *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                 CONCAT26(local_5d8._14_2_,
                                          CONCAT24(local_5d8._12_2_,local_5d8._8_4_)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (local_5a8 != (undefined1  [8])pcVar2) {
              operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar14 = (long *)::std::__cxx11::string::_M_append
                                          (local_5a8,(ulong)(err->_M_dataplus)._M_p);
              local_5d8._0_6_ = SUB86(&local_5c8,0);
              local_5d8._6_2_ = (undefined2)((ulong)&local_5c8 >> 0x30);
              lVar3 = *plVar14;
              plVar1 = plVar14 + 2;
              if ((long *)lVar3 == plVar1) {
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)plVar14[3];
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                     (undefined7)((ulong)plVar14[3] >> 8);
              }
              else {
                local_5d8._0_6_ = (undefined6)lVar3;
                local_5d8._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
              }
              lVar3 = plVar14[1];
              local_5d8._8_4_ = (undefined4)lVar3;
              local_5d8._12_2_ = (undefined2)((ulong)lVar3 >> 0x20);
              local_5d8._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
              *plVar14 = (long)plVar1;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                (long)local_5c8.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              if (local_5a8 != (undefined1  [8])pcVar2) {
                operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
            ::std::ios_base::~ios_base(local_3f0);
            iVar12 = 1;
            goto LAB_002354fa;
          }
        }
        puVar7 = (undefined1 *)CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_));
        if (puVar7 != local_570 + 8) {
          operator_delete(puVar7,CONCAT71(local_570._9_7_,local_570[8]) + 1);
        }
        if (!bVar26) goto LAB_0023808a;
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_100,*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_460._0_8_ = local_450;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"inputs:clearcoat","")
        ;
        pAVar25 = (Animatable<tinyusdz::value::normal3f> *)local_460;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_580,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_510,&local_100,prop,(string *)local_460,local_258);
        if ((undefined1 *)local_460._0_8_ != local_450) {
          operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        uVar5 = CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0]));
        iVar12 = 0;
        if ((uVar5 & 0xfffffffd) == 0) {
          iVar12 = 3;
LAB_002357fe:
          bVar26 = false;
        }
        else {
          bVar26 = true;
          if (uVar5 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
            poVar13 = (ostream *)
                      ::std::ostream::operator<<
                                ((Animatable<tinyusdz::value::normal3f> *)local_460,0xfa2);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar2 = local_5a8 + 0x10;
            local_5a8 = (undefined1  [8])pcVar2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[17],std::__cxx11::string>
                      ((string *)local_5d8,(fmt *)local_5a8,(string *)"inputs:clearcoat",
                       (char (*) [17])(local_580 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar25)
            ;
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_460,
                                 (char *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                 CONCAT26(local_5d8._14_2_,
                                          CONCAT24(local_5d8._12_2_,local_5d8._8_4_)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (local_5a8 != (undefined1  [8])pcVar2) {
              operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar14 = (long *)::std::__cxx11::string::_M_append
                                          (local_5a8,(ulong)(err->_M_dataplus)._M_p);
              local_5d8._0_6_ = SUB86(&local_5c8,0);
              local_5d8._6_2_ = (undefined2)((ulong)&local_5c8 >> 0x30);
              lVar3 = *plVar14;
              plVar1 = plVar14 + 2;
              if ((long *)lVar3 == plVar1) {
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)plVar14[3];
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                     (undefined7)((ulong)plVar14[3] >> 8);
              }
              else {
                local_5d8._0_6_ = (undefined6)lVar3;
                local_5d8._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
              }
              lVar3 = plVar14[1];
              local_5d8._8_4_ = (undefined4)lVar3;
              local_5d8._12_2_ = (undefined2)((ulong)lVar3 >> 0x20);
              local_5d8._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
              *plVar14 = (long)plVar1;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                (long)local_5c8.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              if (local_5a8 != (undefined1  [8])pcVar2) {
                operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
            ::std::ios_base::~ios_base(local_3f0);
            iVar12 = 1;
            goto LAB_002357fe;
          }
        }
        puVar7 = (undefined1 *)CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_));
        if (puVar7 != local_570 + 8) {
          operator_delete(puVar7,CONCAT71(local_570._9_7_,local_570[8]) + 1);
        }
        if (!bVar26) goto LAB_0023808a;
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_120,*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_460._0_8_ = local_450;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_460,"inputs:clearcoatRoughness","");
        pAVar25 = (Animatable<tinyusdz::value::normal3f> *)local_460;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_580,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_510,&local_120,prop,(string *)local_460,local_260);
        if ((undefined1 *)local_460._0_8_ != local_450) {
          operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        uVar5 = CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0]));
        iVar12 = 0;
        if ((uVar5 & 0xfffffffd) == 0) {
          iVar12 = 3;
LAB_00235b02:
          bVar26 = false;
        }
        else {
          bVar26 = true;
          if (uVar5 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
            poVar13 = (ostream *)
                      ::std::ostream::operator<<
                                ((Animatable<tinyusdz::value::normal3f> *)local_460,0xfa4);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar2 = local_5a8 + 0x10;
            local_5a8 = (undefined1  [8])pcVar2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[26],std::__cxx11::string>
                      ((string *)local_5d8,(fmt *)local_5a8,(string *)"inputs:clearcoatRoughness",
                       (char (*) [26])(local_580 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar25)
            ;
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_460,
                                 (char *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                 CONCAT26(local_5d8._14_2_,
                                          CONCAT24(local_5d8._12_2_,local_5d8._8_4_)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (local_5a8 != (undefined1  [8])pcVar2) {
              operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar14 = (long *)::std::__cxx11::string::_M_append
                                          (local_5a8,(ulong)(err->_M_dataplus)._M_p);
              local_5d8._0_6_ = SUB86(&local_5c8,0);
              local_5d8._6_2_ = (undefined2)((ulong)&local_5c8 >> 0x30);
              lVar3 = *plVar14;
              plVar1 = plVar14 + 2;
              if ((long *)lVar3 == plVar1) {
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)plVar14[3];
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                     (undefined7)((ulong)plVar14[3] >> 8);
              }
              else {
                local_5d8._0_6_ = (undefined6)lVar3;
                local_5d8._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
              }
              lVar3 = plVar14[1];
              local_5d8._8_4_ = (undefined4)lVar3;
              local_5d8._12_2_ = (undefined2)((ulong)lVar3 >> 0x20);
              local_5d8._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
              *plVar14 = (long)plVar1;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                (long)local_5c8.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              if (local_5a8 != (undefined1  [8])pcVar2) {
                operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
            ::std::ios_base::~ios_base(local_3f0);
            iVar12 = 1;
            goto LAB_00235b02;
          }
        }
        puVar7 = (undefined1 *)CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_));
        if (puVar7 != local_570 + 8) {
          operator_delete(puVar7,CONCAT71(local_570._9_7_,local_570[8]) + 1);
        }
        if (!bVar26) goto LAB_0023808a;
        local_140._M_allocated_capacity = (size_type)local_130;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_460._0_8_ = local_450;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"inputs:opacity","");
        pAVar25 = (Animatable<tinyusdz::value::normal3f> *)local_460;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_580,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_510,(string *)&local_140,prop,(string *)local_460,local_268);
        if ((undefined1 *)local_460._0_8_ != local_450) {
          operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
        }
        if ((long *)local_140._M_allocated_capacity != local_130) {
          operator_delete((void *)local_140._M_allocated_capacity,local_130[0] + 1);
        }
        uVar5 = CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0]));
        iVar12 = 0;
        if ((uVar5 & 0xfffffffd) == 0) {
          iVar12 = 3;
LAB_00235e06:
          bVar26 = false;
        }
        else {
          bVar26 = true;
          if (uVar5 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
            poVar13 = (ostream *)
                      ::std::ostream::operator<<
                                ((Animatable<tinyusdz::value::normal3f> *)local_460,0xfa6);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar2 = local_5a8 + 0x10;
            local_5a8 = (undefined1  [8])pcVar2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)local_5d8,(fmt *)local_5a8,(string *)"inputs:opacity",
                       (char (*) [15])(local_580 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar25)
            ;
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_460,
                                 (char *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                 CONCAT26(local_5d8._14_2_,
                                          CONCAT24(local_5d8._12_2_,local_5d8._8_4_)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (local_5a8 != (undefined1  [8])pcVar2) {
              operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar14 = (long *)::std::__cxx11::string::_M_append
                                          (local_5a8,(ulong)(err->_M_dataplus)._M_p);
              local_5d8._0_6_ = SUB86(&local_5c8,0);
              local_5d8._6_2_ = (undefined2)((ulong)&local_5c8 >> 0x30);
              lVar3 = *plVar14;
              plVar1 = plVar14 + 2;
              if ((long *)lVar3 == plVar1) {
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)plVar14[3];
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                     (undefined7)((ulong)plVar14[3] >> 8);
              }
              else {
                local_5d8._0_6_ = (undefined6)lVar3;
                local_5d8._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
                local_5c8.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
              }
              lVar3 = plVar14[1];
              local_5d8._8_4_ = (undefined4)lVar3;
              local_5d8._12_2_ = (undefined2)((ulong)lVar3 >> 0x20);
              local_5d8._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
              *plVar14 = (long)plVar1;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                (long)local_5c8.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              if (local_5a8 != (undefined1  [8])pcVar2) {
                operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
            ::std::ios_base::~ios_base(local_3f0);
            iVar12 = 1;
            goto LAB_00235e06;
          }
        }
        puVar7 = (undefined1 *)CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_));
        if (puVar7 != local_570 + 8) {
          operator_delete(puVar7,CONCAT71(local_570._9_7_,local_570[8]) + 1);
        }
        if (!bVar26) goto LAB_0023808a;
        local_160._M_allocated_capacity = (size_type)&local_150;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_160,*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_460._0_8_ = local_450;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_460,"inputs:opacityThreshold","");
        pAVar25 = (Animatable<tinyusdz::value::normal3f> *)local_460;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_580,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_510,(string *)&local_160,prop,(string *)local_460,local_270);
        if ((undefined1 *)local_460._0_8_ != local_450) {
          operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_allocated_capacity != &local_150) {
          operator_delete((void *)local_160._M_allocated_capacity,
                          local_150._M_allocated_capacity + 1);
        }
        uVar5 = CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0]));
        iVar12 = 0;
        if ((uVar5 & 0xfffffffd) == 0) {
          iVar12 = 3;
LAB_002360cb:
          bVar26 = false;
        }
        else {
          bVar26 = true;
          if (uVar5 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
            poVar13 = (ostream *)
                      ::std::ostream::operator<<
                                ((Animatable<tinyusdz::value::normal3f> *)local_460,0xfa8);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            local_5a8 = (undefined1  [8])(local_5a8 + 0x10);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[24],std::__cxx11::string>
                      ((string *)local_5d8,(fmt *)local_5a8,(string *)"inputs:opacityThreshold",
                       (char (*) [24])(local_580 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar25)
            ;
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_460,
                                 (char *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                 CONCAT26(local_5d8._14_2_,
                                          CONCAT24(local_5d8._12_2_,local_5d8._8_4_)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (local_5a8 != (undefined1  [8])(local_5a8 + 0x10)) {
              operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                (long)local_5c8.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              if (local_5a8 != (undefined1  [8])(local_5a8 + 0x10)) {
                operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
            ::std::ios_base::~ios_base(local_3f0);
            iVar12 = 1;
            goto LAB_002360cb;
          }
        }
        puVar7 = (undefined1 *)CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_));
        if (puVar7 != local_570 + 8) {
          operator_delete(puVar7,CONCAT71(local_570._9_7_,local_570[8]) + 1);
        }
        if (!bVar26) goto LAB_0023808a;
        local_180._M_allocated_capacity = (size_type)&local_170;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_180,*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_460._0_8_ = local_450;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"inputs:ior","");
        args = prop;
        pAVar25 = (Animatable<tinyusdz::value::normal3f> *)local_460;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_580,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_510,(string *)&local_180,prop,(string *)local_460,local_278);
        if ((undefined1 *)local_460._0_8_ != local_450) {
          operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_allocated_capacity != &local_170) {
          operator_delete((void *)local_180._M_allocated_capacity,
                          local_170._M_allocated_capacity + 1);
        }
        uVar5 = CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0]));
        iVar12 = 0;
        if ((uVar5 & 0xfffffffd) == 0) {
          iVar12 = 3;
LAB_00236390:
          bVar26 = false;
        }
        else {
          bVar26 = true;
          if (uVar5 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
            poVar13 = (ostream *)
                      ::std::ostream::operator<<
                                ((Animatable<tinyusdz::value::normal3f> *)local_460,0xfaa);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            local_5a8 = (undefined1  [8])(local_5a8 + 0x10);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a8,"Parsing attribute `{}` failed. Error: {}","");
            args = (Property *)(local_580 + 8);
            fmt::format<char[11],std::__cxx11::string>
                      ((string *)local_5d8,(fmt *)local_5a8,(string *)"inputs:ior",
                       (char (*) [11])args,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar25)
            ;
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_460,
                                 (char *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                 CONCAT26(local_5d8._14_2_,
                                          CONCAT24(local_5d8._12_2_,local_5d8._8_4_)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (local_5a8 != (undefined1  [8])(local_5a8 + 0x10)) {
              operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                (long)local_5c8.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              if (local_5a8 != (undefined1  [8])(local_5a8 + 0x10)) {
                operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
            ::std::ios_base::~ios_base(local_3f0);
            iVar12 = 1;
            goto LAB_00236390;
          }
        }
        puVar7 = (undefined1 *)CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_));
        if (puVar7 != local_570 + 8) {
          operator_delete(puVar7,CONCAT71(local_570._9_7_,local_570[8]) + 1);
        }
        if (!bVar26) goto LAB_0023808a;
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d8,*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"inputs:normal","");
        sVar11 = local_2d8._M_string_length;
        sVar10 = local_4e0._M_string_length;
        local_5a0 = (uint *)(local_5a8 + 0x18);
        local_598._M_allocated_capacity = 0;
        local_598._M_local_buf[8] = '\0';
        __n = local_2d8._M_string_length;
        if (local_4e0._M_string_length < local_2d8._M_string_length) {
          __n = local_4e0._M_string_length;
        }
        if (__n == 0) {
          if (local_2d8._M_string_length == local_4e0._M_string_length) goto LAB_00236470;
LAB_00236523:
          local_5a8._0_4_ = 1;
        }
        else {
          iVar12 = bcmp(local_2d8._M_dataplus._M_p,local_4e0._M_dataplus._M_p,__n);
          if ((sVar11 != sVar10) || (iVar12 != 0)) goto LAB_00236523;
LAB_00236470:
          if (((ulong)p_Var18[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
            local_5a8._0_4_ = 7;
            local_580[0] = SUB81(local_570,0);
            local_580._1_2_ = (undefined2)((ulong)local_570 >> 8);
            local_580[3] = (undefined1)((ulong)local_570 >> 0x18);
            local_580._4_4_ = (undefined4)((ulong)local_570 >> 0x20);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_580,
                       "Property {} must be Attribute, but declared as Relationhip.","");
            fmt::format<std::__cxx11::string>
                      ((string *)local_460,(fmt *)local_580,&local_4e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            ::std::__cxx11::string::operator=((string *)(local_5a8 + 8),(string *)local_460);
            if ((undefined1 *)local_460._0_8_ != local_450) {
              operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1)
              ;
            }
            _Var24._M_p = (pointer)CONCAT44(local_580._4_4_,
                                            CONCAT13(local_580[3],
                                                     CONCAT21(local_580._1_2_,local_580[0])));
            if (_Var24._M_p != local_570) {
              uVar23 = CONCAT17(local_570[7],
                                CONCAT16(local_570[6],CONCAT24(local_570._4_2_,local_570._0_4_)));
LAB_00236e6d:
              operator_delete(_Var24._M_p,uVar23 + 1);
            }
          }
          else {
            Attribute::type_name_abi_cxx11_(&local_480,(Attribute *)prop);
            local_460._0_8_ = local_450;
            local_450._0_6_ = 0x6c616d726f6e;
            local_450._6_2_ = 0x6633;
            local_460._8_4_ = 1.12104e-44;
            local_460[0xc] = false;
            local_460[0xd] = false;
            local_460._14_2_ = 0;
            local_450[8] = '\0';
            if (local_480._M_string_length == 8) {
              args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x66336c616d726f6e;
              if (*(long *)local_480._M_dataplus._M_p != 0x66336c616d726f6e) goto LAB_002365f4;
LAB_00236742:
              p_Var4 = p_Var18[6]._M_parent;
              local_2b8 = p_Var18[6]._M_left;
              if (local_2b8 != p_Var4) {
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_2a0,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var18[6]._M_parent);
              }
              iVar12 = *(int *)((long)&p_Var18[0x17]._M_parent + 4);
              if (iVar12 == 1) {
                if (p_Var18[5]._M_left == p_Var18[5]._M_parent) {
                  if (p_Var18[4]._M_right == (_Base_ptr)0x0) {
                    bVar26 = false;
                  }
                  else {
                    iVar12 = (**(code **)p_Var18[4]._M_right)();
                    bVar26 = iVar12 == 4;
                  }
                  if ((!bVar26) && ((p_Var18[5]._M_color & _S_black) == _S_red)) goto LAB_00236806;
                  (local_538->normal)._blocked = true;
LAB_0023697c:
                  local_5c8.
                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                  local_5c8.
                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                  bStack_5b0 = false;
                  local_5c8.
                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_5c8.
                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
                  local_5c8.
                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                  __return_storage_ptr__ = (string *)0x0;
                  local_5d8._8_4_ = 0.0;
                  local_5d8[0xc] = false;
                  local_5d8[0xd] = false;
                  local_5d8._0_6_ = 0;
                  local_5d8._6_2_ = 0;
                  local_548 = (PrimVar *)&p_Var18[4]._M_parent;
                  local_4a0 = p_Var4;
                  if (p_Var18[5]._M_left == p_Var18[5]._M_parent) {
LAB_00236b9c:
                    local_540 = __return_storage_ptr__;
                    if (((char)p_Var18[5]._M_color == _S_red) &&
                       (p_Var18[4]._M_right != (_Base_ptr)0x0)) {
                      poVar16 = (type)(**(code **)p_Var18[4]._M_right)();
                      if ((int)poVar16 != 0) {
                        if (p_Var18[4]._M_right != (_Base_ptr)0x0) {
                          poVar16 = (type)(**(code **)p_Var18[4]._M_right)();
                          if ((int)poVar16 == 1) goto LAB_00236bd3;
                        }
                        goto LAB_00236be0;
                      }
LAB_00236bd3:
                      local_548 = (PrimVar *)((ulong)local_548 & 0xffffffff00000000);
                    }
                    else {
LAB_00236be0:
                      primvar::PrimVar::get_value<tinyusdz::value::normal3f>
                                ((optional<tinyusdz::value::normal3f> *)local_460,local_548);
                      if (local_460[0] != '\x01') {
                        local_5a8._0_4_ = 8;
                        local_580[0] = SUB81(local_570,0);
                        local_580._1_2_ = (undefined2)((ulong)local_570 >> 8);
                        local_580[3] = (undefined1)((ulong)local_570 >> 0x18);
                        local_580._4_4_ = (undefined4)((ulong)local_570 >> 0x20);
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_580,
                                   "Internal error. Invalid attribute value? get_value<{}> failed. Attribute has type {}"
                                   ,"");
                        local_530._0_3_ = SUB83(&local_520,0);
                        local_530._3_5_ = (undefined5)((ulong)&local_520 >> 0x18);
                        local_520._M_allocated_capacity = 0x66336c616d726f6e;
                        local_530._8_3_ = 8;
                        local_530._11_4_ = 0.0;
                        local_530._15_1_ = 0;
                        local_520._M_local_buf[8] = '\0';
                        primvar::PrimVar::type_name_abi_cxx11_(&local_4c0,local_548);
                        fmt::format<std::__cxx11::string,std::__cxx11::string>
                                  ((string *)local_460,(fmt *)local_580,(string *)&local_530,
                                   &local_4c0,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pAVar25);
                        ::std::__cxx11::string::operator=
                                  ((string *)(local_5a8 + 8),(string *)local_460);
                        if ((undefined1 *)local_460._0_8_ != local_450) {
                          operator_delete((void *)local_460._0_8_,
                                          CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
                          operator_delete(local_4c0._M_dataplus._M_p,
                                          local_4c0.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT53(local_530._3_5_,local_530._0_3_) != &local_520) {
                          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT53(local_530._3_5_,local_530._0_3_),
                                          local_520._M_allocated_capacity + 1);
                        }
                        puVar7 = (undefined1 *)
                                 CONCAT44(local_580._4_4_,
                                          CONCAT13(local_580[3],
                                                   CONCAT21(local_580._1_2_,local_580[0])));
                        if (puVar7 != local_570) {
                          operator_delete(puVar7,CONCAT17(local_570[7],
                                                          CONCAT16(local_570[6],
                                                                   CONCAT24(local_570._4_2_,
                                                                            local_570._0_4_))) + 1);
                        }
                        uVar20 = 0;
                        cVar21 = (char)local_540;
                        uVar15 = 0;
                        __return_storage_ptr__ = (string *)0x1;
                        goto LAB_00236dab;
                      }
                      local_5d8._8_4_ = CONCAT22(local_460._14_2_,local_460._12_2_);
                      local_3d = CONCAT44(local_460._8_4_,local_460._4_4_);
                      local_5d8._0_6_ = (undefined6)local_3d;
                      local_5d8._6_2_ = SUB42(local_460._8_4_,2);
                      local_5d8[0xc] = true;
                      local_5d8[0xd] = false;
                      poVar16 = (type)CONCAT71((uint7)(uint3)((uint)local_5d8._8_4_ >> 8),1);
                      local_548 = (PrimVar *)CONCAT44(local_548._4_4_,(int)poVar16);
                      local_35 = (float)local_5d8._8_4_;
                    }
                    cVar21 = (char)local_540;
                    if ((cVar21 != '\0') || ((char)local_548 != '\0')) {
                      poVar16 = nonstd::optional_lite::
                                optional<tinyusdz::Animatable<tinyusdz::value::normal3f>>::operator=
                                          (local_498,
                                           (Animatable<tinyusdz::value::normal3f> *)local_5d8);
                    }
                    uVar15 = CONCAT71((int7)((ulong)poVar16 >> 8),1);
                    __return_storage_ptr__ = (string *)0x0;
                    uVar20 = local_548._0_4_;
                  }
                  else {
                    anon_unknown_0::ConvertToAnimatable<tinyusdz::value::normal3f>
                              ((optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)
                               local_580,local_548);
                    local_460[0] = (char)local_580[0];
                    local_540 = (string *)CONCAT71(local_540._1_7_,local_580[0]);
                    if (local_580[0] == (fmt)0x1) {
                      uVar8 = CONCAT43(local_580._11_4_,local_580._8_3_);
                      local_450._0_6_ = CONCAT24(local_570._4_2_,local_570._0_4_);
                      local_460._8_4_ = (undefined4)uVar8;
                      local_460._12_2_ = SUB42(local_580._11_4_,1);
                      local_460._14_2_ = (undefined2)(CONCAT17(local_580[0xf],uVar8) >> 0x30);
                      local_450[8] = local_570[8];
                      local_450._9_7_ = local_570._9_7_;
                      uStack_440 = (undefined1)local_570._16_8_;
                      uStack_43f = SUB87(local_570._16_8_,1);
                      bStack_438 = SUB81(local_570._24_8_,0);
                      uStack_437 = SUB87(local_570._24_8_,1);
                      local_430 = local_570[0x20];
                      local_5d8._0_6_ = (undefined6)uVar8;
                      local_5d8._6_2_ = local_460._14_2_;
                      local_5d8._8_4_ = local_570._0_4_;
                      local_5d8._12_2_ = local_570._4_2_;
                      ::std::
                      vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                      ::operator=(&local_5c8,
                                  (vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                   *)(local_450 + 8));
                      bStack_5b0 = (bool)local_430;
                    }
                    else {
                      local_5a8._0_4_ = 8;
                      local_530._0_3_ = SUB83(&local_520,0);
                      local_530._3_5_ = (undefined5)((ulong)&local_520 >> 0x18);
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_530,
                                 "Converting timeSamples Attribute data failed for `{}`. Guess TimeSamples have values with different type(expected is `{}`)?"
                                 ,"");
                      local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
                      local_4c0.field_2._M_allocated_capacity = 0x66336c616d726f6e;
                      local_4c0._M_string_length = 8;
                      local_4c0.field_2._M_local_buf[8] = '\0';
                      __return_storage_ptr__ = (string *)local_580;
                      fmt::format<std::__cxx11::string,std::__cxx11::string>
                                (__return_storage_ptr__,(fmt *)&local_530,&local_2d8,&local_4c0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pAVar25);
                      ::std::__cxx11::string::operator=
                                ((string *)(local_5a8 + 8),(string *)__return_storage_ptr__);
                      puVar7 = (undefined1 *)
                               CONCAT44(local_580._4_4_,
                                        CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0])
                                                ));
                      if (puVar7 != local_570) {
                        operator_delete(puVar7,CONCAT17(local_570[7],
                                                        CONCAT16(local_570[6],
                                                                 CONCAT24(local_570._4_2_,
                                                                          local_570._0_4_))) + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
                        operator_delete(local_4c0._M_dataplus._M_p,
                                        local_4c0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT53(local_530._3_5_,local_530._0_3_) != &local_520) {
                        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)CONCAT53(local_530._3_5_,local_530._0_3_),
                                        local_520._M_allocated_capacity + 1);
                      }
                    }
                    if ((local_460[0] == '\x01') &&
                       (pvVar9 = (void *)CONCAT71(local_450._9_7_,local_450[8]),
                       pvVar9 != (void *)0x0)) {
                      operator_delete(pvVar9,CONCAT71(uStack_437,bStack_438) - (long)pvVar9);
                    }
                    __return_storage_ptr__ =
                         (string *)CONCAT71((int7)((ulong)__return_storage_ptr__ >> 8),1);
                    cVar21 = '\0';
                    uVar15 = 0;
                    uVar20 = 0;
                    if ((char)local_540 != '\0') goto LAB_00236b9c;
                  }
LAB_00236dab:
                  cVar22 = (char)__return_storage_ptr__;
                  if (local_5c8.
                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    local_548 = (PrimVar *)CONCAT44(local_548._4_4_,uVar20);
                    local_540 = (string *)CONCAT44(local_540._4_4_,(int)uVar15);
                    operator_delete(local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    CONCAT71(local_5c8.
                                             super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                             _1_7_,local_5c8.
                                                                                                      
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_1_) -
                                    (long)local_5c8.
                                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                    uVar15 = (ulong)local_540 & 0xffffffff;
                    uVar20 = local_548._0_4_;
                  }
                  cVar19 = (char)uVar20;
                  if ((char)uVar15 == '\0') {
LAB_002381a5:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_480._M_dataplus._M_p != &local_480.field_2) {
                      operator_delete(local_480._M_dataplus._M_p,
                                      local_480.field_2._M_allocated_capacity + 1);
                    }
                    if ((cVar22 == '\0') && (local_5a0 != (uint *)(local_5a8 + 0x18))) {
                      uVar23 = CONCAT71(local_598._9_7_,local_598._M_local_buf[8]);
                      _Var24._M_p = (pointer)local_5a0;
                      goto LAB_00236e6d;
                    }
                    goto LAB_00236e75;
                  }
                  goto LAB_00236de6;
                }
LAB_00236806:
                if (p_Var18[3]._M_color != _S_black) goto LAB_0023697c;
                bVar26 = primvar::PrimVar::is_timesamples((PrimVar *)&p_Var18[4]._M_parent);
                if (!bVar26) {
                  primvar::PrimVar::get_value<tinyusdz::value::normal3f>
                            ((optional<tinyusdz::value::normal3f> *)local_460,
                             (PrimVar *)&p_Var18[4]._M_parent);
                  if (local_460[0] == '\x01') {
                    local_580._11_4_ = CONCAT22(local_460._14_2_,local_460._12_2_);
                    local_580[3] = SUB81(local_460._0_8_,4);
                    local_580._4_4_ = (undefined4)(CONCAT44(local_460._8_4_,local_460._4_4_) >> 8);
                    local_580._8_3_ = SUB43(local_460._8_4_,1);
                    local_530._3_5_ = CONCAT41(local_580._4_4_,local_580[3]);
                    local_530._8_3_ = local_580._8_3_;
                    uStack_440 = 0;
                    uStack_43f = 0;
                    bStack_438 = false;
                    local_450._0_6_ = 0;
                    local_450._6_2_ = 0;
                    local_450[8] = '\0';
                    local_450._9_7_ = 0;
                    local_460[0xc] = true;
                    local_460[0xd] = false;
                    local_460._0_4_ = (undefined4)local_530._3_5_;
                    local_460._4_4_ =
                         (undefined4)(CONCAT35(local_580._8_3_,local_530._3_5_) >> 0x20);
                    local_530._11_4_ = local_580._11_4_;
                    local_460._8_4_ = local_580._11_4_;
                    nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>>
                    ::operator=(local_498,(Animatable<tinyusdz::value::normal3f> *)local_460);
                    pvVar9 = (void *)CONCAT26(local_450._6_2_,local_450._0_6_);
                    if (pvVar9 != (void *)0x0) {
                      operator_delete(pvVar9,CONCAT71(uStack_43f,uStack_440) - (long)pvVar9);
                    }
                    goto LAB_0023697c;
                  }
                  local_5a8._0_4_ = 3;
                  local_580[0] = SUB81(local_570,0);
                  local_580._1_2_ = (undefined2)((ulong)local_570 >> 8);
                  local_580[3] = (undefined1)((ulong)local_570 >> 0x18);
                  local_580._4_4_ = (undefined4)((ulong)local_570 >> 0x20);
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_580,
                             "Fallback. Failed to retrieve value with requested type `{}`.","");
                  local_5d8._0_6_ = SUB86(&local_5c8,0);
                  local_5d8._6_2_ = (undefined2)((ulong)&local_5c8 >> 0x30);
                  local_5c8.
                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66336c616d726f6e;
                  local_5d8._8_4_ = 1.12104e-44;
                  local_5d8[0xc] = false;
                  local_5d8[0xd] = false;
                  local_5d8._14_2_ = 0;
                  local_5c8.
                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
                  fmt::format<std::__cxx11::string>
                            ((string *)local_460,(fmt *)local_580,(string *)local_5d8,args_00);
                  ::std::__cxx11::string::operator=((string *)(local_5a8 + 8),(string *)local_460);
                  if ((undefined1 *)local_460._0_8_ != local_450) {
                    operator_delete((void *)local_460._0_8_,
                                    CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
                  }
                  if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                       *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
                    operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                     *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                    (long)local_5c8.
                                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 1);
                  }
                  puVar7 = (undefined1 *)
                           CONCAT44(local_580._4_4_,
                                    CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0])));
                  if (puVar7 != local_570) {
                    operator_delete(puVar7,CONCAT17(local_570[7],
                                                    CONCAT16(local_570[6],
                                                             CONCAT24(local_570._4_2_,
                                                                      local_570._0_4_))) + 1);
                  }
                  cVar22 = '\x01';
                  goto LAB_002381a5;
                }
                local_5a8._0_4_ = 4;
                local_580[0] = SUB81(local_570,0);
                local_580._1_2_ = (undefined2)((ulong)local_570 >> 8);
                local_580[3] = (undefined1)((ulong)local_570 >> 0x18);
                local_580._4_4_ = (undefined4)((ulong)local_570 >> 0x20);
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_580,
                           "TimeSample value is assigned to `uniform` property `{}","");
                fmt::format<std::__cxx11::string>
                          ((string *)local_460,(fmt *)local_580,&local_4e0,args_00);
                ::std::__cxx11::string::operator=((string *)(local_5a8 + 8),(string *)local_460);
                if ((undefined1 *)local_460._0_8_ != local_450) {
                  operator_delete((void *)local_460._0_8_,
                                  CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
                }
                puVar7 = (undefined1 *)
                         CONCAT44(local_580._4_4_,
                                  CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0])));
                if (puVar7 != local_570) {
                  operator_delete(puVar7,CONCAT17(local_570[7],
                                                  CONCAT16(local_570[6],
                                                           CONCAT24(local_570._4_2_,local_570._0_4_)
                                                          )) + 1);
                }
              }
              else {
                if (iVar12 == 0) {
                  (local_538->normal)._empty = true;
                  AttrMetas::operator=(local_488,(AttrMetas *)(p_Var18 + 7));
                }
                else {
                  cVar19 = '\0';
                  cVar21 = '\0';
                  local_4a0 = p_Var4;
LAB_00236de6:
                  if (local_2b8 == local_4a0) {
                    if ((cVar21 == '\0') && (cVar19 == '\0')) {
                      ::std::__cxx11::string::operator=
                                ((string *)(local_5a8 + 8),"Invalid Property type(internal error)");
                      local_5a8._0_4_ = 8;
                      goto LAB_00236e50;
                    }
                  }
                  else if ((cVar21 == '\0') && (cVar19 == '\0')) {
                    (local_538->normal)._empty = true;
                  }
                  AttrMetas::operator=(local_488,(AttrMetas *)(p_Var18 + 7));
                }
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_510,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_4e0);
                local_5a8 = (undefined1  [8])((ulong)local_5a8 & 0xffffffff00000000);
              }
            }
            else {
              local_580[0] = SUB81(local_570,0);
              local_580._1_2_ = (undefined2)((ulong)local_570 >> 8);
              local_580[3] = (undefined1)((ulong)local_570 >> 0x18);
              local_580._4_4_ = (undefined4)((ulong)local_570 >> 0x20);
              local_570._4_2_ = 0x3374;
              local_570._0_4_ = 0x616f6c66;
              local_580._8_3_ = 6;
              local_580._11_4_ = 0.0;
              local_580[0xf] = 0;
              local_570[6] = '\0';
              if ((local_480._M_string_length == 6) &&
                 (args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (ulong)(*(uint *)local_480._M_dataplus._M_p ^ 0x616f6c66),
                 (short)*(uint *)(local_480._M_dataplus._M_p + 4) == 0x3374 &&
                 (*(uint *)local_480._M_dataplus._M_p ^ 0x616f6c66) == 0)) goto LAB_00236742;
LAB_002365f4:
              local_5a8._0_4_ = 3;
              ::std::__cxx11::stringstream::stringstream((stringstream *)local_460);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_450,"Property type mismatch. ",0x18);
              poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_450,local_4e0._M_dataplus._M_p,
                                   local_4e0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," expects type `",0xf);
              local_580[0] = SUB81(local_570,0);
              local_580._1_2_ = (undefined2)((ulong)local_570 >> 8);
              local_580[3] = (undefined1)((ulong)local_570 >> 0x18);
              local_580._4_4_ = (undefined4)((ulong)local_570 >> 0x20);
              local_570._0_4_ = 0x6d726f6e;
              local_570._4_2_ = 0x6c61;
              local_570[6] = '3';
              local_570[7] = 'f';
              local_580._8_3_ = 8;
              local_580._11_4_ = 0.0;
              local_580[0xf] = 0;
              local_570[8] = '\0';
              poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_570,8);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,"` but defined as type `",0x17);
              poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,local_480._M_dataplus._M_p,local_480._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"`",1);
              pcVar6 = (char *)CONCAT44(local_580._4_4_,
                                        CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0])
                                                ));
              if (pcVar6 != local_570) {
                operator_delete(pcVar6,CONCAT17(local_570[7],
                                                CONCAT16(local_570[6],
                                                         CONCAT24(local_570._4_2_,local_570._0_4_)))
                                       + 1);
              }
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::operator=((string *)(local_5a8 + 8),(string *)local_580);
              puVar7 = (undefined1 *)
                       CONCAT44(local_580._4_4_,
                                CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0])));
              if (puVar7 != local_570) {
                operator_delete(puVar7,CONCAT17(local_570[7],
                                                CONCAT16(local_570[6],
                                                         CONCAT24(local_570._4_2_,local_570._0_4_)))
                                       + 1);
              }
              ::std::__cxx11::stringstream::~stringstream((stringstream *)local_460);
              ::std::ios_base::~ios_base(local_3e0);
            }
LAB_00236e50:
            uVar23 = local_480.field_2._M_allocated_capacity;
            _Var24._M_p = local_480._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != &local_480.field_2) goto LAB_00236e6d;
          }
        }
LAB_00236e75:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
          operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
        iVar12 = 0;
        if (((ulong)local_5a8 & 0xfffffffd) == 0) {
          iVar12 = 3;
LAB_002370a7:
          bVar26 = false;
        }
        else {
          bVar26 = true;
          if (local_5a8._0_4_ != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
            poVar13 = (ostream *)
                      ::std::ostream::operator<<
                                ((Animatable<tinyusdz::value::normal3f> *)local_460,0xfac);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            local_5d8._0_6_ = SUB86(&local_5c8,0);
            local_5d8._6_2_ = (undefined2)((ulong)&local_5c8 >> 0x30);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5d8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[14],std::__cxx11::string>
                      ((string *)local_580,(fmt *)local_5d8,(string *)"inputs:normal",
                       (char (*) [14])(local_5a8 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar25)
            ;
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_460,
                                 (char *)CONCAT44(local_580._4_4_,
                                                  CONCAT13(local_580[3],
                                                           CONCAT21(local_580._1_2_,local_580[0]))),
                                 CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_))
                                );
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            puVar7 = (undefined1 *)
                     CONCAT44(local_580._4_4_,
                              CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0])));
            if (puVar7 != local_570) {
              operator_delete(puVar7,CONCAT17(local_570[7],
                                              CONCAT16(local_570[6],
                                                       CONCAT24(local_570._4_2_,local_570._0_4_))) +
                                     1);
            }
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_580,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5d8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_580);
              puVar7 = (undefined1 *)
                       CONCAT44(local_580._4_4_,
                                CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0])));
              if (puVar7 != local_570) {
                operator_delete(puVar7,CONCAT17(local_570[7],
                                                CONCAT16(local_570[6],
                                                         CONCAT24(local_570._4_2_,local_570._0_4_)))
                                       + 1);
              }
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                (long)local_5c8.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
            ::std::ios_base::~ios_base(local_3f0);
            iVar12 = 1;
            goto LAB_002370a7;
          }
        }
        if (local_5a0 != (uint *)(local_5a8 + 0x18)) {
          operator_delete(local_5a0,CONCAT71(local_598._9_7_,local_598._M_local_buf[8]) + 1);
        }
        if (!bVar26) goto LAB_0023808a;
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a0,*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_460._0_8_ = local_450;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_460,"inputs:dispacement","");
        pAVar25 = (Animatable<tinyusdz::value::normal3f> *)local_460;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_580,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_510,&local_1a0,prop,(string *)local_460,local_280);
        if ((undefined1 *)local_460._0_8_ != local_450) {
          operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        uVar5 = CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0]));
        iVar12 = 0;
        if ((uVar5 & 0xfffffffd) == 0) {
          iVar12 = 3;
LAB_00237366:
          bVar26 = false;
        }
        else {
          bVar26 = true;
          if (uVar5 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
            poVar13 = (ostream *)
                      ::std::ostream::operator<<
                                ((Animatable<tinyusdz::value::normal3f> *)local_460,0xfae);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            local_5a8 = (undefined1  [8])(local_5a8 + 0x10);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[19],std::__cxx11::string>
                      ((string *)local_5d8,(fmt *)local_5a8,(string *)"inputs:dispacement",
                       (char (*) [19])(local_580 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar25)
            ;
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_460,
                                 (char *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                 CONCAT26(local_5d8._14_2_,
                                          CONCAT24(local_5d8._12_2_,local_5d8._8_4_)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (local_5a8 != (undefined1  [8])(local_5a8 + 0x10)) {
              operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                (long)local_5c8.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              if (local_5a8 != (undefined1  [8])(local_5a8 + 0x10)) {
                operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
            ::std::ios_base::~ios_base(local_3f0);
            iVar12 = 1;
            goto LAB_00237366;
          }
        }
        puVar7 = (undefined1 *)CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_));
        if (puVar7 != local_570 + 8) {
          operator_delete(puVar7,CONCAT71(local_570._9_7_,local_570[8]) + 1);
        }
        if (!bVar26) goto LAB_0023808a;
        local_1c0._M_allocated_capacity = (size_type)local_1b0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c0,*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_460._0_8_ = local_450;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"inputs:occlusion","")
        ;
        pAVar25 = (Animatable<tinyusdz::value::normal3f> *)local_460;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_580,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_510,(string *)&local_1c0,prop,(string *)local_460,local_288);
        if ((undefined1 *)local_460._0_8_ != local_450) {
          operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
        }
        if ((long *)local_1c0._M_allocated_capacity != local_1b0) {
          operator_delete((void *)local_1c0._M_allocated_capacity,local_1b0[0] + 1);
        }
        uVar5 = CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0]));
        iVar12 = 0;
        if ((uVar5 & 0xfffffffd) == 0) {
          iVar12 = 3;
LAB_0023762b:
          bVar26 = false;
        }
        else {
          bVar26 = true;
          if (uVar5 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
            poVar13 = (ostream *)
                      ::std::ostream::operator<<
                                ((Animatable<tinyusdz::value::normal3f> *)local_460,0xfb0);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            local_5a8 = (undefined1  [8])(local_5a8 + 0x10);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[17],std::__cxx11::string>
                      ((string *)local_5d8,(fmt *)local_5a8,(string *)"inputs:occlusion",
                       (char (*) [17])(local_580 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar25)
            ;
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_460,
                                 (char *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                 CONCAT26(local_5d8._14_2_,
                                          CONCAT24(local_5d8._12_2_,local_5d8._8_4_)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (local_5a8 != (undefined1  [8])(local_5a8 + 0x10)) {
              operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                (long)local_5c8.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              if (local_5a8 != (undefined1  [8])(local_5a8 + 0x10)) {
                operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
            ::std::ios_base::~ios_base(local_3f0);
            iVar12 = 1;
            goto LAB_0023762b;
          }
        }
        puVar7 = (undefined1 *)CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_));
        if (puVar7 != local_570 + 8) {
          operator_delete(puVar7,CONCAT71(local_570._9_7_,local_570[8]) + 1);
        }
        if (!bVar26) goto LAB_0023808a;
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e0,*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_460._0_8_ = local_450;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_460,"inputs:useSpecularWorkflow","");
        pAVar25 = (Animatable<tinyusdz::value::normal3f> *)local_460;
        anon_unknown_0::ParseTypedAttribute<int>
                  ((ParseResult *)local_580,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_510,&local_1e0,prop,(string *)local_460,local_290);
        if ((undefined1 *)local_460._0_8_ != local_450) {
          operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        uVar5 = CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0]));
        iVar12 = 0;
        if ((uVar5 & 0xfffffffd) == 0) {
          iVar12 = 3;
LAB_002378f0:
          bVar26 = false;
        }
        else {
          bVar26 = true;
          if (uVar5 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
            poVar13 = (ostream *)
                      ::std::ostream::operator<<
                                ((Animatable<tinyusdz::value::normal3f> *)local_460,0xfb2);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            local_5a8 = (undefined1  [8])(local_5a8 + 0x10);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[27],std::__cxx11::string>
                      ((string *)local_5d8,(fmt *)local_5a8,(string *)"inputs:useSpecularWorkflow",
                       (char (*) [27])(local_580 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar25)
            ;
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_460,
                                 (char *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                 CONCAT26(local_5d8._14_2_,
                                          CONCAT24(local_5d8._12_2_,local_5d8._8_4_)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (local_5a8 != (undefined1  [8])(local_5a8 + 0x10)) {
              operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                (long)local_5c8.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              if (local_5a8 != (undefined1  [8])(local_5a8 + 0x10)) {
                operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
            ::std::ios_base::~ios_base(local_3f0);
            iVar12 = 1;
            goto LAB_002378f0;
          }
        }
        puVar7 = (undefined1 *)CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_));
        if (puVar7 != local_570 + 8) {
          operator_delete(puVar7,CONCAT71(local_570._9_7_,local_570[8]) + 1);
        }
        if (!bVar26) goto LAB_0023808a;
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_200,*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_460._0_8_ = local_450;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"outputs:surface","");
        pAVar25 = (Animatable<tinyusdz::value::normal3f> *)local_460;
        anon_unknown_0::ParseShaderOutputTerminalAttribute<tinyusdz::Token>
                  ((ParseResult *)local_580,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_510,&local_200,prop,(string *)local_460,local_298);
        if ((undefined1 *)local_460._0_8_ != local_450) {
          operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        uVar5 = CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0]));
        iVar12 = 0;
        if ((uVar5 & 0xfffffffd) == 0) {
          iVar12 = 3;
LAB_00237bb5:
          bVar26 = false;
        }
        else {
          bVar26 = true;
          if (uVar5 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
            poVar13 = (ostream *)
                      ::std::ostream::operator<<
                                ((Animatable<tinyusdz::value::normal3f> *)local_460,0xfb4);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            local_5a8 = (undefined1  [8])(local_5a8 + 0x10);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a8,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[16],std::__cxx11::string>
                      ((string *)local_5d8,(fmt *)local_5a8,(string *)"outputs:surface",
                       (char (*) [16])(local_580 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar25)
            ;
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_460,
                                 (char *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                 CONCAT26(local_5d8._14_2_,
                                          CONCAT24(local_5d8._12_2_,local_5d8._8_4_)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (local_5a8 != (undefined1  [8])(local_5a8 + 0x10)) {
              operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                (long)local_5c8.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              if (local_5a8 != (undefined1  [8])(local_5a8 + 0x10)) {
                operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
            ::std::ios_base::~ios_base(local_3f0);
            iVar12 = 1;
            goto LAB_00237bb5;
          }
        }
        puVar7 = (undefined1 *)CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_));
        if (puVar7 != local_570 + 8) {
          operator_delete(puVar7,CONCAT71(local_570._9_7_,local_570[8]) + 1);
        }
        if (!bVar26) goto LAB_0023808a;
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_220,*(long *)(p_Var18 + 1),
                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
        local_460._0_8_ = local_450;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_460,"outputs:displacement","");
        pAVar25 = (Animatable<tinyusdz::value::normal3f> *)local_460;
        anon_unknown_0::ParseShaderOutputTerminalAttribute<tinyusdz::Token>
                  ((ParseResult *)local_580,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_510,&local_220,prop,(string *)local_460,local_2a8);
        if ((undefined1 *)local_460._0_8_ != local_450) {
          operator_delete((void *)local_460._0_8_,CONCAT26(local_450._6_2_,local_450._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        uVar5 = CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0]));
        iVar12 = 0;
        if ((uVar5 & 0xfffffffd) == 0) {
          iVar12 = 3;
LAB_00237e7a:
          bVar26 = false;
        }
        else {
          bVar26 = true;
          if (uVar5 != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_460,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
            poVar13 = (ostream *)
                      ::std::ostream::operator<<
                                ((Animatable<tinyusdz::value::normal3f> *)local_460,0xfb6);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            local_5a8 = (undefined1  [8])(local_5a8 + 0x10);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a8,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[21],std::__cxx11::string>
                      ((string *)local_5d8,(fmt *)local_5a8,(string *)"outputs:displacement",
                       (char (*) [21])(local_580 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar25)
            ;
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_460,
                                 (char *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                 CONCAT26(local_5d8._14_2_,
                                          CONCAT24(local_5d8._12_2_,local_5d8._8_4_)));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            if (local_5a8 != (undefined1  [8])(local_5a8 + 0x10)) {
              operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
              if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
                operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                                (long)local_5c8.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              if (local_5a8 != (undefined1  [8])(local_5a8 + 0x10)) {
                operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
            ::std::ios_base::~ios_base(local_3f0);
            iVar12 = 1;
            goto LAB_00237e7a;
          }
        }
        puVar7 = (undefined1 *)CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_));
        if (puVar7 != local_570 + 8) {
          operator_delete(puVar7,CONCAT71(local_570._9_7_,local_570[8]) + 1);
        }
        if (!bVar26) goto LAB_0023808a;
        p_Var4 = p_Var18 + 1;
        cVar17 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_510,(key_type *)p_Var4);
        if ((_Rb_tree_header *)cVar17._M_node == &local_510._M_impl.super__Rb_tree_header) {
          this = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                 ::operator[](local_2b0,(key_type *)p_Var4);
          Property::operator=(this,prop);
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_510,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var4);
        }
        cVar17 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_510,(key_type *)p_Var4);
        if ((_Rb_tree_header *)cVar17._M_node == &local_510._M_impl.super__Rb_tree_header) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"[warn]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_460,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_460,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_460,"():",3);
          poVar13 = (ostream *)
                    ::std::ostream::operator<<
                              ((Animatable<tinyusdz::value::normal3f> *)local_460,0xfb8);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_580,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var4);
          poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_460,
                               (char *)CONCAT44(local_580._4_4_,
                                                CONCAT13(local_580[3],
                                                         CONCAT21(local_580._1_2_,local_580[0]))),
                               CONCAT17(local_580[0xf],CONCAT43(local_580._11_4_,local_580._8_3_)));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
          puVar7 = (undefined1 *)
                   CONCAT44(local_580._4_4_,
                            CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0])));
          if (puVar7 != local_570) {
            operator_delete(puVar7,CONCAT17(local_570[7],
                                            CONCAT16(local_570[6],
                                                     CONCAT24(local_570._4_2_,local_570._0_4_))) + 1
                           );
          }
          if (local_490 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_580,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_5d8,err);
            ::std::__cxx11::string::operator=((string *)local_490,(string *)local_580);
            puVar7 = (undefined1 *)
                     CONCAT44(local_580._4_4_,
                              CONCAT13(local_580[3],CONCAT21(local_580._1_2_,local_580[0])));
            if (puVar7 != local_570) {
              operator_delete(puVar7,CONCAT17(local_570[7],
                                              CONCAT16(local_570[6],
                                                       CONCAT24(local_570._4_2_,local_570._0_4_))) +
                                     1);
            }
            if ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                 *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_) != &local_5c8) {
              operator_delete((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                               *)CONCAT26(local_5d8._6_2_,local_5d8._0_6_),
                              (long)local_5c8.
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
          ::std::ios_base::~ios_base(local_3f0);
        }
      }
      else {
LAB_0023808a:
        if ((iVar12 != 3) && (iVar12 != 0)) {
          bVar26 = false;
          goto LAB_002381f7;
        }
      }
      p_Var18 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var18);
    } while (p_Var18 != local_228);
    bVar26 = true;
  }
LAB_002381f7:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_510,(_Link_type)local_510._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar26;
}

Assistant:

bool ReconstructShader<UsdPreviewSurface>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPreviewSurface *surface,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)spec;
  (void)references;
  (void)options;

  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:diffuseColor", UsdPreviewSurface,
                         surface->diffuseColor)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:emissiveColor", UsdPreviewSurface,
                         surface->emissiveColor)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:roughness", UsdPreviewSurface,
                         surface->roughness)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:specularColor", UsdPreviewSurface,
                         surface->specularColor)  // specular workflow
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:metallic", UsdPreviewSurface,
                         surface->metallic)  // non specular workflow
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:clearcoat", UsdPreviewSurface,
                         surface->clearcoat)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:clearcoatRoughness",
                         UsdPreviewSurface, surface->clearcoatRoughness)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:opacity", UsdPreviewSurface,
                         surface->opacity)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:opacityThreshold",
                         UsdPreviewSurface, surface->opacityThreshold)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:ior", UsdPreviewSurface,
                         surface->ior)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:normal", UsdPreviewSurface,
                         surface->normal)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:dispacement", UsdPreviewSurface,
                         surface->displacement)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:occlusion", UsdPreviewSurface,
                         surface->occlusion)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:useSpecularWorkflow",
                         UsdPreviewSurface, surface->useSpecularWorkflow)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:surface", UsdPreviewSurface,
                   surface->outputsSurface)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:displacement", UsdPreviewSurface,
                   surface->outputsDisplacement)
    ADD_PROPERTY(table, prop, UsdPreviewSurface, surface->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}